

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assertions.cpp
# Opt level: O2

string * rc::detail::makeWrongExceptionMessage
                   (string *__return_storage_ptr__,string *file,int line,string *assertion,
                   string *expected)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::operator+(&local_48,"Thrown exception did not match ",expected);
  std::operator+(&bStack_68,&local_48,".");
  makeMessage(__return_storage_ptr__,file,line,assertion,&bStack_68);
  std::__cxx11::string::~string((string *)&bStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string makeWrongExceptionMessage(const std::string &file,
                                      int line,
                                      const std::string &assertion,
                                      const std::string &expected) {
  return makeMessage(file,
                     line,
                     assertion,
                     "Thrown exception did not match " + expected + ".");
}